

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_start_tx(udp_ep *ep)

{
  udp_txdesc *puVar1;
  size_t sVar2;
  void *pvVar3;
  uint local_5c;
  undefined1 auStack_58 [4];
  int niov;
  nni_iov iov [3];
  nng_msg *msg;
  udp_txdesc *desc;
  udp_txring *ring;
  udp_ep *ep_local;
  
  if ((((ep->tx_ring).count != 0) && ((ep->started & 1U) != 0)) && ((ep->tx_busy & 1U) == 0)) {
    ep->tx_busy = true;
    puVar1 = (ep->tx_ring).descs + (ep->tx_ring).tail;
    if ((puVar1->submitted & 1U) == 0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp.c"
                ,0x1a7,"desc->submitted");
    }
    iov[0].iov_buf = (void *)0x14;
    local_5c = 1;
    iov[2].iov_len = (size_t)puVar1->payload;
    _auStack_58 = puVar1;
    if ((nni_msg *)iov[2].iov_len != (nni_msg *)0x0) {
      sVar2 = nni_msg_header_len((nni_msg *)iov[2].iov_len);
      if (sVar2 != 0) {
        iov[0].iov_len = (size_t)nni_msg_header((nni_msg *)iov[2].iov_len);
        iov[1].iov_buf = (void *)nni_msg_header_len((nni_msg *)iov[2].iov_len);
        local_5c = 2;
      }
      sVar2 = nni_msg_len((nni_msg *)iov[2].iov_len);
      if (sVar2 != 0) {
        pvVar3 = nni_msg_body((nni_msg *)iov[2].iov_len);
        iov[(long)(int)local_5c + -1].iov_len = (size_t)pvVar3;
        pvVar3 = (void *)nni_msg_len((nni_msg *)iov[2].iov_len);
        iov[(int)local_5c].iov_buf = pvVar3;
        local_5c = local_5c + 1;
      }
    }
    nni_aio_set_input(&ep->tx_aio,0,&puVar1->sa);
    nni_aio_set_iov(&ep->tx_aio,local_5c,(nni_iov *)auStack_58);
    nni_aio_set_timeout(&ep->tx_aio,10000);
    nni_plat_udp_send(ep->udp,&ep->tx_aio);
  }
  return;
}

Assistant:

static void
udp_start_tx(udp_ep *ep)
{
	udp_txring *ring = &ep->tx_ring;
	udp_txdesc *desc;
	nng_msg    *msg;

	if ((!ring->count) || (!ep->started) || ep->tx_busy) {
		return;
	}
	ep->tx_busy = true;

	// NB: This does not advance the tail yet.
	// The tail will be advanced when the operation is complete.
	desc = &ring->descs[ring->tail];
	nni_iov iov[3];
	int     niov = 0;

	NNI_ASSERT(desc->submitted);
	iov[0].iov_buf = &desc->header;
	iov[0].iov_len = sizeof(desc->header);
	niov++;

	if ((msg = desc->payload) != NULL) {
		if (nni_msg_header_len(msg) > 0) {
			iov[niov].iov_buf = nni_msg_header(msg);
			iov[niov].iov_len = nni_msg_header_len(msg);
			niov++;
		}
		if (nni_msg_len(msg) > 0) {
			iov[niov].iov_buf = nni_msg_body(msg);
			iov[niov].iov_len = nni_msg_len(msg);
			niov++;
		}
	}
	nni_aio_set_input(&ep->tx_aio, 0, &desc->sa);
	nni_aio_set_iov(&ep->tx_aio, niov, iov);
	// it should *never* take this long, but allow for ARP resolution
	nni_aio_set_timeout(&ep->tx_aio, NNI_SECOND * 10);
	nni_udp_send(ep->udp, &ep->tx_aio);
}